

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O2

size_t __thiscall TilePool::allocateSector(TilePool *this)

{
  pointer puVar1;
  bool bVar2;
  long lVar3;
  unsigned_long *in_R8;
  unsigned_long *in_R9;
  long lVar4;
  _Head_base<0UL,_TilePool::PoolItem_*,_false> _Var5;
  size_t __position;
  format_string_t<unsigned_long,_unsigned_long_&,_unsigned_long> fmt;
  format_string_t<unsigned_long,_unsigned_long> fmt_00;
  __uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_48 = &this->itemsAllocatedCount_;
  lVar4 = 0;
  _Var5._M_head_impl = (PoolItem *)0x0;
  do {
    puVar1 = (this->itemsAllocatedCount_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->itemsAllocatedCount_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= _Var5._M_head_impl)
    {
      details::make_unique<TilePool::PoolItem,_0>();
      std::
      vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
      ::emplace_back<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>
                ((vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
                  *)this,(unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *
                         )&local_50);
      std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::~unique_ptr
                ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                 &local_50);
      std::bitset<64UL>::set
                (&((this->items_).
                   super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                   super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                   .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl)->allocated,0,
                 true);
      local_50._M_t.
      super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
      super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl._0_4_ = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_48,(uint *)&local_50);
      lVar4 = (long)(this->items_).
                    super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->items_).
                    super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_50._M_t.
      super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
      super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl =
           (tuple<TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>)
           (lVar4 * 8 + -0x40);
      local_40 = lVar4 >> 3;
      fmt_00.str.size_ = (size_t)&local_50;
      fmt_00.str.data_ = (char *)0x38;
      spdlog::debug<unsigned_long,unsigned_long>
                ((spdlog *)"TilePool allocating sector {} at end (items size is {}).",fmt_00,
                 &local_40,in_R8);
      return ((long)(this->items_).
                    super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->items_).
                   super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) * 8 - 0x40;
    }
    if (puVar1[(long)_Var5._M_head_impl] < 0x40) {
      lVar3 = 1;
      __position = 0;
      while (__position != 0x40) {
        bVar2 = std::bitset<64UL>::test
                          ((bitset<64UL> *)
                           ((long)(this->items_).
                                  super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)_Var5._M_head_impl]._M_t.
                                  super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                           + 0x1030),__position);
        __position = __position + 1;
        lVar3 = lVar3 + -1;
        if (!bVar2) {
          local_50._M_t.
          super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
          super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl =
               (tuple<TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>)
               (tuple<TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>)
               _Var5._M_head_impl;
          std::bitset<64UL>::set
                    ((bitset<64UL> *)
                     ((long)(this->items_).
                            super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)_Var5._M_head_impl]._M_t
                            .
                            super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                     + 0x1030),-lVar3,true);
          puVar1 = (this->itemsAllocatedCount_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)_Var5._M_head_impl;
          *puVar1 = *puVar1 + 1;
          local_40 = lVar4 - lVar3;
          local_38 = (long)(this->items_).
                           super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->items_).
                           super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
          fmt.str.size_ = (size_t)&local_40;
          fmt.str.data_ = (char *)0x3d;
          spdlog::debug<unsigned_long,unsigned_long&,unsigned_long>
                    ((spdlog *)"TilePool allocating sector {} at index {} (items size is {}).",fmt,
                     (unsigned_long *)&local_50,&local_38,in_R9);
          return (long)local_50._M_t.
                       super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                       .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl * 0x40 -
                 lVar3;
        }
      }
    }
    _Var5._M_head_impl = (PoolItem *)&((_Var5._M_head_impl)->chunk).tiles_[0].field_0x1;
    lVar4 = lVar4 + 0x40;
  } while( true );
}

Assistant:

size_t TilePool::allocateSector() {
    /*++upperId_;
    const auto itemIndex = static_cast<size_t>((upperId_ - baseId_) / CHUNK_AREA);
    if (itemIndex == items_.size()) {
        items_.emplace_back(details::make_unique<PoolItem>());
    }
    //spdlog::debug("TilePool allocating id {} at index {} (items size is {}).", upperId_, itemIndex, items_.size());

    PoolItem* item = items_[itemIndex].get();
    item->allocated.set(upperId_ % CHUNK_AREA);
    ++item->allocatedCount;
    return {
        item->chunk.accessTile(upperId_ % CHUNK_AREA),
        upperId_
    };*/

    for (size_t i = 0; i < itemsAllocatedCount_.size(); ++i) {
        if (itemsAllocatedCount_[i] < SECTORS_PER_CHUNK) {
            for (int j = 0; j < SECTORS_PER_CHUNK; ++j) {
                if (!items_[i]->allocated.test(j)) {
                    items_[i]->allocated.set(j);
                    ++itemsAllocatedCount_[i];
                    spdlog::debug("TilePool allocating sector {} at index {} (items size is {}).", i * SECTORS_PER_CHUNK + j, i, items_.size());
                    return i * SECTORS_PER_CHUNK + j;
                }
            }
        }
    }
    items_.emplace_back(details::make_unique<PoolItem>());
    items_.back()->allocated.set(0);
    itemsAllocatedCount_.push_back(1);
    spdlog::debug("TilePool allocating sector {} at end (items size is {}).", (items_.size() - 1) * SECTORS_PER_CHUNK, items_.size());
    return (items_.size() - 1) * SECTORS_PER_CHUNK;
}